

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O1

void raviV_settable_i(lua_State *L,TValue *t,TValue *key,StkId val)

{
  double dVar1;
  LuaType LVar2;
  Table *t_00;
  RaviArray *pRVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ushort uVar6;
  TValue *slot;
  ulong uVar7;
  char *pcVar8;
  Value VVar9;
  lua_Number value;
  double dVar10;
  undefined1 auVar11 [16];
  
  LVar2 = t->tt_;
  if (LVar2 == 0x8005) {
    if (key->tt_ == 0x13) {
      t_00 = (Table *)(t->value_).gc;
      if (t_00->tt == '\x05') {
        uVar7 = (key->value_).i - 1;
        if (uVar7 < t_00->sizearray) {
          slot = t_00->array + uVar7;
        }
        else {
          slot = luaH_getint(t_00,(key->value_).i);
        }
        if (slot->tt_ == 0) goto LAB_001312ad;
        slot->value_ = val->value_;
        uVar6 = val->tt_;
        slot->tt_ = uVar6;
        if (((short)uVar6 < 0) &&
           (((uVar6 & 0x7f) != (ushort)((slot->value_).gc)->tt ||
            ((L != (lua_State *)0x0 &&
             ((((slot->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
          pcVar8 = "0";
        }
        else {
          if (-1 < (short)val->tt_) {
            return;
          }
          if ((t_00->tt & 0xe) < 10) {
            if ((t_00->marked & 0x20) == 0) {
              return;
            }
            if ((((val->value_).gc)->marked & 0x18) == 0) {
              return;
            }
            luaC_barrierback_(L,(GCObject *)t_00);
            return;
          }
          pcVar8 = "(((h)->tt) & 0x0F) < (9+1)";
        }
      }
      else {
        pcVar8 = "(((t)->value_).gc)->tt == 5";
      }
      goto LAB_0013148b;
    }
  }
  else if (LVar2 == 0x8025) {
    pRVar3 = (RaviArray *)(t->value_).gc;
    if ((pRVar3->tt != '\x15') && (pRVar3->tt != '%')) {
LAB_001314a3:
      pcVar8 = 
      "((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
      ;
      goto LAB_0013148b;
    }
    if (val->tt_ == 0x13) {
      if (key->tt_ == 0x13) {
        uVar7 = (key->value_).i & 0xffffffff;
        if (pRVar3->len <= (uint)(key->value_).b) {
          value = (lua_Number)(val->value_).i;
LAB_001313c9:
          raviH_set_float(L,pRVar3,uVar7,value);
          return;
        }
        pcVar8 = pRVar3->data;
        VVar9.n = (lua_Number)(val->value_).i;
LAB_001313a2:
        *(Value *)(pcVar8 + uVar7 * 8) = VVar9;
        return;
      }
    }
    else {
      if (val->tt_ != 3) {
        pcVar8 = "value cannot be converted to number";
        goto LAB_001314bc;
      }
      if (key->tt_ == 0x13) {
        uVar7 = (key->value_).i & 0xffffffff;
        if (pRVar3->len <= (uint)(key->value_).b) {
          value = (val->value_).n;
          goto LAB_001313c9;
        }
        pcVar8 = pRVar3->data;
        VVar9 = val->value_;
        goto LAB_001313a2;
      }
    }
  }
  else {
    if (LVar2 != 0x8015) {
      slot = (TValue *)0x0;
LAB_001312ad:
      luaV_finishset(L,t,key,val,slot);
      return;
    }
    pRVar3 = (RaviArray *)(t->value_).gc;
    if ((pRVar3->tt != '\x15') && (pRVar3->tt != '%')) goto LAB_001314a3;
    uVar6 = 1;
    if (val->tt_ == 3) {
      dVar1 = (val->value_).n;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = dVar1;
      auVar11 = vroundsd_avx(auVar11,auVar11,9);
      dVar10 = auVar11._0_8_;
      if ((dVar10 != dVar1) || (NAN(dVar10) || NAN(dVar1))) goto LAB_001313ed;
      uVar4 = vcmppd_avx512vl(auVar11,ZEXT816(0x43e0000000000000),5);
      uVar5 = vcmppd_avx512vl(ZEXT816(0xc3e0000000000000),auVar11,6);
      uVar6 = (ushort)uVar5 & 3 | (ushort)uVar4 & 3;
      VVar9.gc = (GCObject *)0x0;
      if ((uVar6 & 1) == 0) {
        VVar9.i = (long)dVar10;
      }
    }
    else {
      if (val->tt_ == 0x13) {
        if (key->tt_ == 0x13) {
          uVar7 = (key->value_).i & 0xffffffff;
          if (pRVar3->len <= (uint)(key->value_).b) {
            VVar9 = (Value)(val->value_).i;
            goto LAB_0013141e;
          }
          pcVar8 = pRVar3->data;
          VVar9 = val->value_;
          goto LAB_0013140d;
        }
        goto LAB_00131469;
      }
LAB_001313ed:
      VVar9.gc = (GCObject *)0x0;
    }
    if ((uVar6 & 1) != 0) {
      pcVar8 = "value cannot be converted to integer";
LAB_001314bc:
      luaG_runerror(L,pcVar8);
    }
    if (key->tt_ == 0x13) {
      uVar7 = (key->value_).i & 0xffffffff;
      if (pRVar3->len <= (uint)(key->value_).b) {
LAB_0013141e:
        raviH_set_int(L,pRVar3,uVar7,VVar9.i);
        return;
      }
      pcVar8 = pRVar3->data;
LAB_0013140d:
      *(Value *)(pcVar8 + uVar7 * 8) = VVar9;
      return;
    }
  }
LAB_00131469:
  pcVar8 = "((((key))->tt_) == (((3) | ((1) << 4))))";
LAB_0013148b:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                ,0xc7b,"void raviV_settable_i(lua_State *, const TValue *, TValue *, StkId)");
}

Assistant:

void raviV_settable_i(lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE_I(L, t, key, val);
}